

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWArray.h
# Opt level: O2

void __thiscall
COLLADAFW::Array<COLLADABU::Math::Matrix4>::allocMemory
          (Array<COLLADABU::Math::Matrix4> *this,size_t count,int flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Matrix4 *pMVar5;
  Matrix4 *pMVar6;
  ulong uVar7;
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  int iVar12;
  undefined1 auVar11 [16];
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = count;
  uVar7 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x88),8) == 0) {
    uVar7 = SUB168(auVar2 * ZEXT816(0x88),0);
  }
  pMVar5 = (Matrix4 *)operator_new__(uVar7);
  auVar4 = _DAT_008737d0;
  auVar3 = _DAT_008737c0;
  auVar2 = _DAT_008737b0;
  if (count != 0) {
    uVar7 = 0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = count * 0x88 - 0x88;
    auVar1 = auVar1 / ZEXT816(0x88);
    auVar8._8_4_ = auVar1._0_4_;
    auVar8._0_8_ = auVar1._0_8_;
    auVar8._12_4_ = auVar1._4_4_;
    auVar8 = auVar8 ^ _DAT_008737d0;
    pMVar6 = pMVar5;
    do {
      auVar10._8_4_ = (int)uVar7;
      auVar10._0_8_ = uVar7;
      auVar10._12_4_ = (int)(uVar7 >> 0x20);
      auVar11 = (auVar10 | auVar3) ^ auVar4;
      iVar9 = auVar8._4_4_;
      if ((bool)(~(auVar11._4_4_ == iVar9 && auVar8._0_4_ < auVar11._0_4_ || iVar9 < auVar11._4_4_)
                & 1)) {
        pMVar6->mState = UNKNOWN;
      }
      if ((auVar11._12_4_ != auVar8._12_4_ || auVar11._8_4_ <= auVar8._8_4_) &&
          auVar11._12_4_ <= auVar8._12_4_) {
        pMVar6[1].mState = UNKNOWN;
      }
      auVar10 = (auVar10 | auVar2) ^ auVar4;
      iVar12 = auVar10._4_4_;
      if (iVar12 <= iVar9 && (iVar12 != iVar9 || auVar10._0_4_ <= auVar8._0_4_)) {
        pMVar6[2].mState = UNKNOWN;
        pMVar6[3].mState = UNKNOWN;
      }
      uVar7 = uVar7 + 4;
      pMVar6 = pMVar6 + 4;
    } while ((auVar1._0_8_ + 4U & 0x3fffffffffffffc) != uVar7);
  }
  this->mData = pMVar5;
  this->mCount = 0;
  this->mCapacity = count;
  this->mFlags = this->mFlags | flags;
  return;
}

Assistant:

void allocMemory ( size_t count, int flags = DEFAULT_ALLOC_FLAGS )
        {
            setData ( new Type[count], 0, count );
            mFlags |= flags;
        }